

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_set_icc(LodePNGInfo *info,char *name,uchar *profile,uint profile_size)

{
  uint uVar1;
  
  if (info->iccp_name != (char *)0x0) {
    free(info->iccp_name);
    info->iccp_name = (char *)0x0;
    free(info->iccp_profile);
    info->iccp_profile = (uchar *)0x0;
    info->iccp_profile_size = 0;
  }
  uVar1 = lodepng_assign_icc(info,name,profile,profile_size);
  return uVar1;
}

Assistant:

unsigned lodepng_set_icc(LodePNGInfo* info, const char* name, const unsigned char* profile, unsigned profile_size) {
  if(info->iccp_name) lodepng_clear_icc(info);

  return lodepng_assign_icc(info, name, profile, profile_size);
}